

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::getIntegerv(ReferenceContext *this,deUint32 pname,int *param)

{
  int *param_local;
  deUint32 pname_local;
  ReferenceContext *this_local;
  
  if (pname == 0xd33) {
    *param = (this->m_limits).maxTexture2DSize;
  }
  else if (pname == 0x8073) {
    *param = (this->m_limits).maxTexture3DSize;
  }
  else if (pname == 0x84e8) {
    *param = (this->m_limits).maxRenderbufferSize;
  }
  else if (pname == 0x851c) {
    *param = (this->m_limits).maxTextureCubeSize;
  }
  else if (pname == 0x8869) {
    *param = (this->m_limits).maxVertexAttribs;
  }
  else if (pname == 0x8872) {
    *param = (this->m_limits).maxTextureImageUnits;
  }
  else if (pname == 0x88ff) {
    *param = (this->m_limits).maxTexture2DArrayLayers;
  }
  else {
    setError(this,0x500);
  }
  return;
}

Assistant:

void ReferenceContext::getIntegerv (deUint32 pname, int* param)
{
	switch (pname)
	{
		case GL_MAX_TEXTURE_SIZE:			*param = m_limits.maxTexture2DSize;			break;
		case GL_MAX_CUBE_MAP_TEXTURE_SIZE:	*param = m_limits.maxTextureCubeSize;		break;
		case GL_MAX_ARRAY_TEXTURE_LAYERS:	*param = m_limits.maxTexture2DArrayLayers;	break;
		case GL_MAX_3D_TEXTURE_SIZE:		*param = m_limits.maxTexture3DSize;			break;
		case GL_MAX_RENDERBUFFER_SIZE:		*param = m_limits.maxRenderbufferSize;		break;
		case GL_MAX_TEXTURE_IMAGE_UNITS:	*param = m_limits.maxTextureImageUnits;		break;
		case GL_MAX_VERTEX_ATTRIBS:			*param = m_limits.maxVertexAttribs;			break;

		default:
			setError(GL_INVALID_ENUM);
			break;
	}
}